

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O3

int __thiscall
zmq::detail::socket_base::setsockopt
          (socket_base *this,int __fd,int __level,int __optname,void *__optval,socklen_t __optlen)

{
  int iVar1;
  error_t *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  iVar1 = zmq_setsockopt(this->_handle,CONCAT44(in_register_00000034,__fd),
                         CONCAT44(in_register_00000014,__level));
  if (iVar1 == 0) {
    return 0;
  }
  this_00 = (error_t *)__cxa_allocate_exception(0x10);
  error_t::error_t(this_00);
  __cxa_throw(this_00,&error_t::typeinfo,std::exception::~exception);
}

Assistant:

void setsockopt(int option_, const void *optval_, size_t optvallen_)
    {
        int rc = zmq_setsockopt(_handle, option_, optval_, optvallen_);
        if (rc != 0)
            throw error_t();
    }